

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O3

bool_t prf_material_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t **ppuVar1;
  pool_t pool_id;
  uint8_t *puVar2;
  uint16_t uVar3;
  ushort uVar4;
  float32_t *pfVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  bool_t bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  float32_t fVar14;
  
  uVar3 = bf_get_uint16_be(bfile);
  node->opcode = uVar3;
  if (uVar3 == prf_material_palette_info.opcode) {
    uVar4 = bf_get_uint16_be(bfile);
    node->length = uVar4;
    ppuVar1 = &node->data;
    iVar12 = 4;
    if (4 < uVar4) {
      pfVar5 = (float32_t *)*ppuVar1;
      if (pfVar5 == (float32_t *)0x0) {
        pool_id = state->model->mempool_id;
        if (pool_id == 0) {
          pfVar5 = (float32_t *)malloc((ulong)(uVar4 - 4));
        }
        else {
          pfVar5 = (float32_t *)pool_malloc(pool_id,uVar4 - 4);
        }
        *ppuVar1 = (uint8_t *)pfVar5;
        if (pfVar5 == (float32_t *)0x0) {
          prf_error(9,"memory allocation problem (returned NULL)");
          uVar7 = 4;
          goto LAB_0010adc7;
        }
        uVar4 = node->length;
      }
      if (7 < uVar4) {
        fVar14 = bf_get_float32_be(bfile);
        *pfVar5 = fVar14;
        uVar4 = node->length;
        iVar12 = 8;
        if (0xb < uVar4) {
          pfVar5 = pfVar5 + 1;
          iVar11 = 0xc;
          iVar8 = 4;
          do {
            fVar14 = bf_get_float32_be(bfile);
            *pfVar5 = fVar14;
            uVar4 = node->length;
            iVar12 = iVar11;
            if ((int)(uint)uVar4 < iVar8 + 0xc) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[1] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0xc;
            if ((int)(uint)uVar4 < iVar8 + 0x10) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[2] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x10;
            if ((int)(uint)uVar4 < iVar8 + 0x14) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[3] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x14;
            if ((int)(uint)uVar4 < iVar8 + 0x18) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[4] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x18;
            if ((int)(uint)uVar4 < iVar8 + 0x1c) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[5] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x1c;
            if ((int)(uint)uVar4 < iVar8 + 0x20) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[6] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x20;
            if ((int)(uint)uVar4 < iVar8 + 0x24) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[7] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x24;
            if ((int)(uint)uVar4 < iVar8 + 0x28) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[8] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x28;
            if ((int)(uint)uVar4 < iVar8 + 0x2c) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[9] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x2c;
            if ((int)(uint)uVar4 < iVar8 + 0x30) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[10] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x30;
            if ((int)(uint)uVar4 < iVar8 + 0x34) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[0xb] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x34;
            if ((int)(uint)uVar4 < iVar8 + 0x38) break;
            fVar14 = bf_get_float32_be(bfile);
            pfVar5[0xc] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x38;
            if ((int)(uint)uVar4 < iVar8 + 0x3c) break;
            fVar14 = (float32_t)bf_get_uint32_be(bfile);
            pfVar5[0xd] = fVar14;
            uVar4 = node->length;
            iVar12 = iVar8 + 0x3c;
            if ((int)(uint)uVar4 < iVar8 + 0x48) break;
            bf_read(bfile,(uint8_t *)(pfVar5 + 0xe),0xc);
            lVar13 = 0;
            iVar10 = iVar8 + 0x48;
            do {
              uVar4 = node->length;
              if ((int)(uint)uVar4 < iVar10 + 4) {
                iVar6 = iVar10 + 4;
                goto LAB_0010b05d;
              }
              fVar14 = (float32_t)bf_get_uint32_be(bfile);
              pfVar5[lVar13 + 0x11] = fVar14;
              lVar13 = lVar13 + 1;
              iVar10 = iVar10 + 4;
            } while (lVar13 != 0x1c);
            uVar4 = node->length;
            iVar6 = iVar8 + 0xbc;
            iVar10 = iVar8 + 0xb8;
LAB_0010b05d:
            iVar12 = iVar10;
            if ((int)(uint)uVar4 < iVar6) break;
            puVar2 = node->data;
            pfVar5 = (float32_t *)(puVar2 + iVar10);
            fVar14 = bf_get_float32_be(bfile);
            *(float32_t *)(puVar2 + (long)iVar10 + -4) = fVar14;
            uVar4 = node->length;
            iVar11 = iVar10 + 8;
            iVar12 = iVar6;
            iVar8 = iVar10;
          } while (iVar11 <= (int)(uint)uVar4);
        }
      }
    }
    bVar9 = 1;
    uVar7 = (uint)uVar4 - iVar12;
    if (uVar7 != 0 && iVar12 <= (int)(uint)uVar4) {
      bf_read(bfile,*ppuVar1 + (long)iVar12 + -4,uVar7);
    }
  }
  else {
    prf_error(9,"tried material palette load method for node of type %d.",(ulong)uVar3);
    uVar7 = 2;
LAB_0010adc7:
    bVar9 = 0;
    bf_rewind(bfile,uVar7);
  }
  return bVar9;
}

Assistant:

static
bool_t
prf_material_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos, count;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) { /* node preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    count = 0;
    do {
        int i;
        node_data * data;
        data = (node_data *) (node->data + pos - 4);

        if ( node->length < (pos + 4) ) break;
        data->ambient_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->diffuse_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->specular_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->emissive_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->shininess = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alpha = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;

        if ( node->length < (pos + 12) ) break;
        bf_read( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        for ( i = 0; i < 28 && node->length >= (pos + 4); i++ ) {
            data->reserved1[i] = bf_get_uint32_be( bfile ); pos += 4;
        }
        count++;
    } while ( TRUE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4, node->length - pos );

    return TRUE;
}